

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# radix_partitioned_hashtable.cpp
# Opt level: O2

void __thiscall duckdb::RadixHTGlobalSinkState::Destroy(RadixHTGlobalSinkState *this)

{
  pointer puVar1;
  bool bVar2;
  reference this_00;
  pointer pAVar3;
  pointer this_01;
  TupleDataLayout *this_02;
  reference this_03;
  type this_04;
  idx_t *piVar4;
  TupleDataChunkState *pTVar5;
  idx_t count;
  pointer this_05;
  RowOperationsState row_state;
  unique_lock<std::mutex> guard;
  TupleDataLayout layout;
  TupleDataChunkIterator iterator;
  
  if (((this->scan_pin_properties != DESTROY_AFTER_DONE) && (this->count_before_combining != 0)) &&
     ((this->partitions).
      super_vector<duckdb::unique_ptr<duckdb::AggregatePartition,_std::default_delete<duckdb::AggregatePartition>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::AggregatePartition,_std::default_delete<duckdb::AggregatePartition>,_true>_>_>
      .
      super__Vector_base<duckdb::unique_ptr<duckdb::AggregatePartition,_std::default_delete<duckdb::AggregatePartition>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::AggregatePartition,_std::default_delete<duckdb::AggregatePartition>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (this->partitions).
      super_vector<duckdb::unique_ptr<duckdb::AggregatePartition,_std::default_delete<duckdb::AggregatePartition>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::AggregatePartition,_std::default_delete<duckdb::AggregatePartition>,_true>_>_>
      .
      super__Vector_base<duckdb::unique_ptr<duckdb::AggregatePartition,_std::default_delete<duckdb::AggregatePartition>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::AggregatePartition,_std::default_delete<duckdb::AggregatePartition>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_finish)) {
    this_00 = vector<duckdb::unique_ptr<duckdb::AggregatePartition,_std::default_delete<duckdb::AggregatePartition>,_true>,_true>
              ::get<true>(&this->partitions,0);
    pAVar3 = unique_ptr<duckdb::AggregatePartition,_std::default_delete<duckdb::AggregatePartition>,_true>
             ::operator->(this_00);
    this_01 = unique_ptr<duckdb::TupleDataCollection,_std::default_delete<duckdb::TupleDataCollection>,_true>
              ::operator->(&pAVar3->data);
    this_02 = TupleDataCollection::GetLayout(this_01);
    TupleDataLayout::Copy(&layout,this_02);
    if (layout.aggr_destructor_idxs.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start !=
        layout.aggr_destructor_idxs.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      ::std::unique_lock<std::mutex>::unique_lock
                (&guard,&(this->super_GlobalSinkState).super_StateWithBlockableTasks.lock);
      this_03 = vector<duckdb::shared_ptr<duckdb::ArenaAllocator,_true>,_true>::back
                          (&this->stored_allocators);
      row_state.allocator = shared_ptr<duckdb::ArenaAllocator,_true>::operator*(this_03);
      row_state.addresses.super_unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>_>.
      _M_t.super___uniq_ptr_impl<duckdb::Vector,_std::default_delete<duckdb::Vector>_>._M_t.
      super__Tuple_impl<0UL,_duckdb::Vector_*,_std::default_delete<duckdb::Vector>_>.
      super__Head_base<0UL,_duckdb::Vector_*,_false>._M_head_impl =
           (unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>_>)
           (__uniq_ptr_data<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true,_true>)0x0;
      puVar1 = (this->partitions).
               super_vector<duckdb::unique_ptr<duckdb::AggregatePartition,_std::default_delete<duckdb::AggregatePartition>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::AggregatePartition,_std::default_delete<duckdb::AggregatePartition>,_true>_>_>
               .
               super__Vector_base<duckdb::unique_ptr<duckdb::AggregatePartition,_std::default_delete<duckdb::AggregatePartition>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::AggregatePartition,_std::default_delete<duckdb::AggregatePartition>,_true>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (this_05 = (this->partitions).
                     super_vector<duckdb::unique_ptr<duckdb::AggregatePartition,_std::default_delete<duckdb::AggregatePartition>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::AggregatePartition,_std::default_delete<duckdb::AggregatePartition>,_true>_>_>
                     .
                     super__Vector_base<duckdb::unique_ptr<duckdb::AggregatePartition,_std::default_delete<duckdb::AggregatePartition>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::AggregatePartition,_std::default_delete<duckdb::AggregatePartition>,_true>_>_>
                     ._M_impl.super__Vector_impl_data._M_start; this_05 != puVar1;
          this_05 = this_05 + 1) {
        pAVar3 = unique_ptr<duckdb::AggregatePartition,_std::default_delete<duckdb::AggregatePartition>,_true>
                 ::operator->(this_05);
        this_04 = unique_ptr<duckdb::TupleDataCollection,_std::default_delete<duckdb::TupleDataCollection>,_true>
                  ::operator*(&pAVar3->data);
        piVar4 = TupleDataCollection::Count(this_04);
        if (*piVar4 != 0) {
          TupleDataChunkIterator::TupleDataChunkIterator(&iterator,this_04,DESTROY_AFTER_DONE,false)
          ;
          pTVar5 = TupleDataChunkIterator::GetChunkState(&iterator);
          do {
            count = TupleDataChunkIterator::GetCurrentChunkCount(&iterator);
            RowOperations::DestroyStates(&row_state,&layout,&pTVar5->row_locations,count);
            bVar2 = TupleDataChunkIterator::Next(&iterator);
          } while (bVar2);
          TupleDataCollection::Reset(this_04);
          TupleDataScanState::~TupleDataScanState(&iterator.state);
        }
      }
      ::std::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>_>::~unique_ptr
                (&row_state.addresses.
                  super_unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>_>);
      ::std::unique_lock<std::mutex>::~unique_lock(&guard);
    }
    TupleDataLayout::~TupleDataLayout(&layout);
  }
  return;
}

Assistant:

void RadixHTGlobalSinkState::Destroy() {
	if (scan_pin_properties == TupleDataPinProperties::DESTROY_AFTER_DONE || count_before_combining == 0 ||
	    partitions.empty()) {
		// Already destroyed / empty
		return;
	}

	TupleDataLayout layout = partitions[0]->data->GetLayout().Copy();
	if (!layout.HasDestructor()) {
		return; // No destructors, exit
	}

	// There are aggregates with destructors: Call the destructor for each of the aggregates
	auto guard = Lock();
	RowOperationsState row_state(*stored_allocators.back());
	for (auto &partition : partitions) {
		auto &data_collection = *partition->data;
		if (data_collection.Count() == 0) {
			continue;
		}
		TupleDataChunkIterator iterator(data_collection, TupleDataPinProperties::DESTROY_AFTER_DONE, false);
		auto &row_locations = iterator.GetChunkState().row_locations;
		do {
			RowOperations::DestroyStates(row_state, layout, row_locations, iterator.GetCurrentChunkCount());
		} while (iterator.Next());
		data_collection.Reset();
	}
}